

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_usingDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,char *dictStart,
              int dictSize)

{
  char *pcVar1;
  byte *pbVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  undefined8 uVar6;
  ushort uVar7;
  ushort uVar8;
  int iVar9;
  ushort *puVar10;
  char *pcVar11;
  char *pcVar12;
  ushort *puVar13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  size_t sVar17;
  long lVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  ushort *puVar23;
  size_t prefixSize;
  long lVar24;
  ulong uVar25;
  ulong __n;
  char *pcVar26;
  int iStack_38;
  
  iStack_38 = (int)source;
  if (dictSize != 0) {
    prefixSize = (size_t)dictSize;
    if (dictStart + prefixSize != dest) {
      iVar9 = -1;
      if (-1 < maxOutputSize && source != (char *)0x0) {
        pcVar12 = dictStart + prefixSize;
        if (dictStart == (char *)0x0) {
          pcVar12 = (char *)0x0;
        }
        if (maxOutputSize == 0) {
          if (compressedSize == 1) {
            iVar9 = -(uint)(*source != '\0');
          }
        }
        else if (compressedSize != 0) {
          pbVar2 = (byte *)(source + compressedSize);
          pcVar19 = dest + (uint)maxOutputSize;
          pcVar15 = pcVar19 + -7;
          pcVar11 = dest;
          puVar23 = (ushort *)source;
          do {
            while( true ) {
              puVar10 = (ushort *)((long)puVar23 + 1);
              bVar3 = (byte)*puVar23;
              sVar17 = (size_t)(uint)(bVar3 >> 4);
              if (bVar3 >> 4 == 0xf) break;
              if ((source + (long)compressedSize + -0x10 <= puVar10) ||
                 (dest + ((ulong)(uint)maxOutputSize - 0x20) < pcVar11)) goto LAB_0011f11e;
              uVar6 = *(undefined8 *)((long)puVar23 + 9);
              *(undefined8 *)pcVar11 = *(undefined8 *)puVar10;
              *(undefined8 *)(pcVar11 + 8) = uVar6;
              pcVar20 = pcVar11 + sVar17;
              uVar25 = (ulong)(bVar3 & 0xf);
              puVar23 = (ushort *)((long)puVar10 + sVar17);
              puVar10 = puVar23 + 1;
              uVar7 = *puVar23;
              pcVar22 = pcVar20 + -(ulong)uVar7;
              if (((uVar25 == 0xf) || (uVar7 < 8)) || (pcVar22 < dest)) goto LAB_0011f1d4;
              *(undefined8 *)pcVar20 = *(undefined8 *)pcVar22;
              *(undefined8 *)(pcVar20 + 8) = *(undefined8 *)(pcVar22 + 8);
              *(undefined2 *)(pcVar20 + 0x10) = *(undefined2 *)(pcVar22 + 0x10);
              pcVar11 = pcVar20 + uVar25 + 4;
              puVar23 = puVar10;
            }
            if (pbVar2 + -0xf <= puVar10) goto LAB_0011f441;
            puVar23 = puVar23 + 1;
            lVar24 = 0;
            puVar13 = puVar10;
            do {
              puVar10 = (ushort *)((long)puVar13 + 1);
              if (pbVar2 + -0xf < puVar10) goto LAB_0011f441;
              uVar7 = *puVar13;
              lVar24 = lVar24 + (ulong)(byte)uVar7;
              puVar23 = (ushort *)((long)puVar23 + 1);
              puVar13 = puVar10;
            } while ((ulong)(byte)uVar7 == 0xff);
            if (((lVar24 == -1) || (sVar17 = lVar24 + 0xf, CARRY8((ulong)pcVar11,sVar17))) ||
               ((ulong)-(long)puVar23 < sVar17)) goto LAB_0011f441;
LAB_0011f11e:
            pcVar20 = pcVar11 + sVar17;
            if ((pcVar19 + -0xc < pcVar20) ||
               (puVar23 = (ushort *)((long)puVar10 + sVar17), pbVar2 + -8 < puVar23)) {
              if (((byte *)((long)puVar10 + sVar17) == pbVar2) && (pcVar20 <= pcVar19)) {
                memmove(pcVar11,puVar10,sVar17);
                return (int)pcVar20 - (int)dest;
              }
LAB_0011f441:
              return ~(uint)puVar10 + iStack_38;
            }
            do {
              *(undefined8 *)pcVar11 = *(undefined8 *)puVar10;
              pcVar11 = pcVar11 + 8;
              puVar10 = puVar10 + 4;
            } while (pcVar11 < pcVar20);
            uVar7 = *puVar23;
            puVar10 = puVar23 + 1;
            pcVar22 = pcVar20 + -(ulong)uVar7;
            uVar25 = (ulong)(bVar3 & 0xf);
LAB_0011f1d4:
            if ((int)uVar25 == 0xf) {
              lVar24 = 0;
              puVar23 = puVar10;
              do {
                puVar10 = (ushort *)((long)puVar23 + 1);
                if (pbVar2 + -4 < puVar10) goto LAB_0011f441;
                uVar8 = *puVar23;
                lVar24 = lVar24 + (ulong)(byte)uVar8;
                puVar23 = puVar10;
              } while ((ulong)(byte)uVar8 == 0xff);
              uVar25 = lVar24 + 0xf;
              if ((lVar24 == -1) || (CARRY8((ulong)pcVar20,uVar25))) goto LAB_0011f441;
            }
            if ((prefixSize < 0x10000) && (pcVar22 + prefixSize < dest)) goto LAB_0011f441;
            uVar25 = uVar25 + 4;
            pcVar26 = pcVar20 + uVar25;
            pcVar11 = pcVar26;
            puVar23 = puVar10;
            if (pcVar22 < dest) {
              if (pcVar19 + -5 < pcVar26) goto LAB_0011f441;
              __n = (long)dest - (long)pcVar22;
              uVar14 = uVar25 - __n;
              if (uVar25 < __n || uVar14 == 0) {
                memmove(pcVar20,pcVar12 + -__n,uVar25);
              }
              else {
                memcpy(pcVar20,pcVar12 + -__n,__n);
                pcVar11 = pcVar20 + __n;
                if ((ulong)((long)pcVar11 - (long)dest) < uVar14) {
                  pcVar20 = dest;
                  if ((long)__n < (long)uVar25) {
                    do {
                      *pcVar11 = *pcVar20;
                      pcVar11 = pcVar11 + 1;
                      pcVar20 = pcVar20 + 1;
                    } while (pcVar11 < pcVar26);
                  }
                }
                else {
                  memcpy(pcVar11,dest,uVar14);
                  pcVar11 = pcVar26;
                }
              }
            }
            else {
              if (uVar7 < 8) {
                pcVar20[0] = '\0';
                pcVar20[1] = '\0';
                pcVar20[2] = '\0';
                pcVar20[3] = '\0';
                *pcVar20 = *pcVar22;
                pcVar20[1] = pcVar22[1];
                pcVar20[2] = pcVar22[2];
                pcVar20[3] = pcVar22[3];
                uVar5 = inc32table[uVar7];
                *(undefined4 *)(pcVar20 + 4) = *(undefined4 *)(pcVar22 + uVar5);
                pcVar22 = pcVar22 + ((ulong)uVar5 - (long)dec64table[uVar7]);
              }
              else {
                *(undefined8 *)pcVar20 = *(undefined8 *)pcVar22;
                pcVar22 = pcVar22 + 8;
              }
              pcVar1 = pcVar20 + 8;
              if (pcVar19 + -0xc < pcVar26) {
                if (pcVar19 + -5 < pcVar26) goto LAB_0011f441;
                pcVar20 = pcVar22;
                pcVar21 = pcVar1;
                if (pcVar1 < pcVar15) {
                  do {
                    *(undefined8 *)pcVar21 = *(undefined8 *)pcVar20;
                    pcVar21 = pcVar21 + 8;
                    pcVar20 = pcVar20 + 8;
                  } while (pcVar21 < pcVar15);
                  pcVar22 = pcVar22 + ((long)pcVar15 - (long)pcVar1);
                  pcVar1 = pcVar15;
                }
                for (; pcVar1 < pcVar26; pcVar1 = pcVar1 + 1) {
                  cVar4 = *pcVar22;
                  pcVar22 = pcVar22 + 1;
                  *pcVar1 = cVar4;
                }
              }
              else {
                *(undefined8 *)pcVar1 = *(undefined8 *)pcVar22;
                if (0x10 < uVar25) {
                  pcVar20 = pcVar20 + 0x10;
                  do {
                    pcVar22 = pcVar22 + 8;
                    *(undefined8 *)pcVar20 = *(undefined8 *)pcVar22;
                    pcVar20 = pcVar20 + 8;
                  } while (pcVar20 < pcVar26);
                }
              }
            }
          } while( true );
        }
      }
      return iVar9;
    }
    if (dictSize < 0xffff) {
      iVar9 = LZ4_decompress_safe_withSmallPrefix
                        (source,dest,compressedSize,maxOutputSize,prefixSize);
      return iVar9;
    }
    iVar9 = -1;
    if (-1 < maxOutputSize && source != (char *)0x0) {
      if (maxOutputSize == 0) {
        if (compressedSize == 1) {
          iVar9 = -(uint)(*source != '\0');
        }
      }
      else if (compressedSize != 0) {
        pbVar2 = (byte *)(source + compressedSize);
        uVar25 = (ulong)(uint)maxOutputSize;
        pcVar12 = dest + (uVar25 - 7);
        lVar24 = 0;
        puVar23 = (ushort *)source;
        do {
          while( true ) {
            pcVar15 = dest + lVar24;
            puVar10 = (ushort *)((long)puVar23 + 1);
            bVar3 = (byte)*puVar23;
            sVar17 = (size_t)(uint)(bVar3 >> 4);
            if (bVar3 >> 4 == 0xf) break;
            if ((source + (long)compressedSize + -0x10 <= puVar10) ||
               (dest + (uVar25 - 0x20) < pcVar15)) goto LAB_0011ed91;
            uVar6 = *(undefined8 *)((long)puVar23 + 9);
            *(undefined8 *)pcVar15 = *(undefined8 *)puVar10;
            *(undefined8 *)(pcVar15 + 8) = uVar6;
            lVar24 = lVar24 + sVar17;
            uVar14 = (ulong)(bVar3 & 0xf);
            puVar23 = (ushort *)((long)puVar10 + sVar17);
            puVar10 = puVar23 + 1;
            uVar7 = *puVar23;
            lVar16 = lVar24 - (ulong)uVar7;
            if (uVar7 < 8 || uVar14 == 0xf) goto LAB_0011ee4d;
            *(undefined8 *)(dest + lVar24) = *(undefined8 *)(dest + lVar16);
            *(undefined8 *)(dest + lVar24 + 8) = *(undefined8 *)(dest + lVar16 + 8);
            *(undefined2 *)(dest + lVar24 + 0x10) = *(undefined2 *)(dest + lVar16 + 0x10);
            lVar24 = lVar24 + uVar14 + 4;
            puVar23 = puVar10;
          }
          if (pbVar2 + -0xf <= puVar10) goto LAB_0011efc9;
          puVar23 = puVar23 + 1;
          lVar16 = 0;
          puVar13 = puVar10;
          do {
            puVar10 = (ushort *)((long)puVar13 + 1);
            if (pbVar2 + -0xf < puVar10) goto LAB_0011efc9;
            uVar7 = *puVar13;
            lVar16 = lVar16 + (ulong)(byte)uVar7;
            puVar23 = (ushort *)((long)puVar23 + 1);
            puVar13 = puVar10;
          } while ((ulong)(byte)uVar7 == 0xff);
          if (((lVar16 == -1) || (sVar17 = lVar16 + 0xf, CARRY8((ulong)pcVar15,sVar17))) ||
             ((ulong)-(long)puVar23 < sVar17)) goto LAB_0011efc9;
LAB_0011ed91:
          lVar24 = lVar24 + sVar17;
          if ((dest + (uVar25 - 0xc) < dest + lVar24) ||
             (puVar23 = (ushort *)((long)puVar10 + sVar17), pbVar2 + -8 < puVar23)) {
            if (((byte *)((long)puVar10 + sVar17) == pbVar2) && (lVar24 <= (long)uVar25)) {
              memmove(pcVar15,puVar10,sVar17);
              return (int)lVar24;
            }
LAB_0011efc9:
            return ~(uint)puVar10 + iStack_38;
          }
          do {
            *(undefined8 *)pcVar15 = *(undefined8 *)puVar10;
            pcVar15 = pcVar15 + 8;
            puVar10 = puVar10 + 4;
          } while (pcVar15 < dest + lVar24);
          uVar7 = *puVar23;
          puVar10 = puVar23 + 1;
          lVar16 = lVar24 - (ulong)uVar7;
          uVar14 = (ulong)(bVar3 & 0xf);
LAB_0011ee4d:
          pcVar15 = dest + lVar24;
          if ((int)uVar14 == 0xf) {
            lVar18 = 0;
            puVar23 = puVar10;
            do {
              puVar10 = (ushort *)((long)puVar23 + 1);
              if (pbVar2 + -4 < puVar10) goto LAB_0011efc9;
              uVar8 = *puVar23;
              lVar18 = lVar18 + (ulong)(byte)uVar8;
              puVar23 = puVar10;
            } while ((ulong)(byte)uVar8 == 0xff);
            uVar14 = lVar18 + 0xf;
            if ((lVar18 == -1) || (CARRY8((ulong)pcVar15,uVar14))) goto LAB_0011efc9;
          }
          if (lVar16 < -0x10000) goto LAB_0011efc9;
          pcVar19 = dest + lVar16;
          if (uVar7 < 8) {
            pcVar15[0] = '\0';
            pcVar15[1] = '\0';
            pcVar15[2] = '\0';
            pcVar15[3] = '\0';
            *pcVar15 = *pcVar19;
            pcVar15[1] = pcVar19[1];
            pcVar15[2] = pcVar19[2];
            pcVar15[3] = pcVar19[3];
            uVar5 = inc32table[uVar7];
            *(undefined4 *)(pcVar15 + 4) = *(undefined4 *)(pcVar19 + uVar5);
            pcVar19 = pcVar19 + ((ulong)uVar5 - (long)dec64table[uVar7]);
          }
          else {
            *(undefined8 *)pcVar15 = *(undefined8 *)pcVar19;
            pcVar19 = pcVar19 + 8;
          }
          lVar24 = lVar24 + uVar14 + 4;
          pcVar20 = dest + lVar24;
          pcVar11 = pcVar15 + 8;
          puVar23 = puVar10;
          if (dest + (uVar25 - 0xc) < pcVar20) {
            if (dest + (uVar25 - 5) < pcVar20) goto LAB_0011efc9;
            pcVar15 = pcVar19;
            pcVar22 = pcVar11;
            if (pcVar11 < pcVar12) {
              do {
                *(undefined8 *)pcVar22 = *(undefined8 *)pcVar15;
                pcVar22 = pcVar22 + 8;
                pcVar15 = pcVar15 + 8;
              } while (pcVar22 < pcVar12);
              pcVar19 = pcVar19 + ((long)pcVar12 - (long)pcVar11);
              pcVar11 = pcVar12;
            }
            for (; pcVar11 < pcVar20; pcVar11 = pcVar11 + 1) {
              cVar4 = *pcVar19;
              pcVar19 = pcVar19 + 1;
              *pcVar11 = cVar4;
            }
          }
          else {
            *(undefined8 *)pcVar11 = *(undefined8 *)pcVar19;
            if (0x10 < uVar14 + 4) {
              pcVar15 = pcVar15 + 0x10;
              do {
                pcVar19 = pcVar19 + 8;
                *(undefined8 *)pcVar15 = *(undefined8 *)pcVar19;
                pcVar15 = pcVar15 + 8;
              } while (pcVar15 < pcVar20);
            }
          }
        } while( true );
      }
    }
    return iVar9;
  }
  iVar9 = -1;
  if (-1 < maxOutputSize && source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        iVar9 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pbVar2 = (byte *)(source + compressedSize);
      pcVar15 = dest + (uint)maxOutputSize;
      pcVar12 = pcVar15 + -7;
      puVar23 = (ushort *)source;
      pcVar19 = dest;
      do {
        while( true ) {
          puVar10 = (ushort *)((long)puVar23 + 1);
          bVar3 = (byte)*puVar23;
          sVar17 = (size_t)(uint)(bVar3 >> 4);
          if (bVar3 >> 4 == 0xf) break;
          if ((source + (long)compressedSize + -0x10 <= puVar10) ||
             (dest + ((ulong)(uint)maxOutputSize - 0x20) < pcVar19)) goto LAB_0011e68a;
          uVar6 = *(undefined8 *)((long)puVar23 + 9);
          *(undefined8 *)pcVar19 = *(undefined8 *)puVar10;
          *(undefined8 *)(pcVar19 + 8) = uVar6;
          pcVar11 = pcVar19 + sVar17;
          uVar25 = (ulong)(bVar3 & 0xf);
          puVar23 = (ushort *)((long)puVar10 + sVar17);
          puVar10 = puVar23 + 1;
          uVar7 = *puVar23;
          pcVar20 = pcVar11 + -(ulong)uVar7;
          if (((uVar25 == 0xf) || (uVar7 < 8)) || (pcVar20 < dest)) goto LAB_0011e739;
          *(undefined8 *)pcVar11 = *(undefined8 *)pcVar20;
          *(undefined8 *)(pcVar11 + 8) = *(undefined8 *)(pcVar20 + 8);
          *(undefined2 *)(pcVar11 + 0x10) = *(undefined2 *)(pcVar20 + 0x10);
          pcVar19 = pcVar11 + uVar25 + 4;
          puVar23 = puVar10;
        }
        if (pbVar2 + -0xf <= puVar10) goto LAB_0011e8ae;
        puVar23 = puVar23 + 1;
        lVar24 = 0;
        puVar13 = puVar10;
        do {
          puVar10 = (ushort *)((long)puVar13 + 1);
          if (pbVar2 + -0xf < puVar10) goto LAB_0011e8ae;
          uVar7 = *puVar13;
          lVar24 = lVar24 + (ulong)(byte)uVar7;
          puVar23 = (ushort *)((long)puVar23 + 1);
          puVar13 = puVar10;
        } while ((ulong)(byte)uVar7 == 0xff);
        if (((lVar24 == -1) || (sVar17 = lVar24 + 0xf, CARRY8((ulong)pcVar19,sVar17))) ||
           ((ulong)-(long)puVar23 < sVar17)) goto LAB_0011e8ae;
LAB_0011e68a:
        pcVar11 = pcVar19 + sVar17;
        if ((pcVar15 + -0xc < pcVar11) ||
           (puVar23 = (ushort *)((long)puVar10 + sVar17), pbVar2 + -8 < puVar23)) {
          if (((byte *)((long)puVar10 + sVar17) == pbVar2) && (pcVar11 <= pcVar15)) {
            memmove(pcVar19,puVar10,sVar17);
            return (int)pcVar11 - (int)dest;
          }
LAB_0011e8ae:
          return ~(uint)puVar10 + iStack_38;
        }
        do {
          *(undefined8 *)pcVar19 = *(undefined8 *)puVar10;
          pcVar19 = pcVar19 + 8;
          puVar10 = puVar10 + 4;
        } while (pcVar19 < pcVar11);
        uVar7 = *puVar23;
        puVar10 = puVar23 + 1;
        pcVar20 = pcVar11 + -(ulong)uVar7;
        uVar25 = (ulong)(bVar3 & 0xf);
LAB_0011e739:
        if ((int)uVar25 == 0xf) {
          lVar24 = 0;
          puVar23 = puVar10;
          do {
            puVar10 = (ushort *)((long)puVar23 + 1);
            if (pbVar2 + -4 < puVar10) goto LAB_0011e8ae;
            uVar8 = *puVar23;
            lVar24 = lVar24 + (ulong)(byte)uVar8;
            puVar23 = puVar10;
          } while ((ulong)(byte)uVar8 == 0xff);
          uVar25 = lVar24 + 0xf;
          if ((lVar24 == -1) || (CARRY8((ulong)pcVar11,uVar25))) goto LAB_0011e8ae;
        }
        if (pcVar20 < dest) goto LAB_0011e8ae;
        if (uVar7 < 8) {
          pcVar11[0] = '\0';
          pcVar11[1] = '\0';
          pcVar11[2] = '\0';
          pcVar11[3] = '\0';
          *pcVar11 = *pcVar20;
          pcVar11[1] = pcVar20[1];
          pcVar11[2] = pcVar20[2];
          pcVar11[3] = pcVar20[3];
          uVar5 = inc32table[uVar7];
          *(undefined4 *)(pcVar11 + 4) = *(undefined4 *)(pcVar20 + uVar5);
          pcVar20 = pcVar20 + ((ulong)uVar5 - (long)dec64table[uVar7]);
        }
        else {
          *(undefined8 *)pcVar11 = *(undefined8 *)pcVar20;
          pcVar20 = pcVar20 + 8;
        }
        pcVar19 = pcVar11 + uVar25 + 4;
        pcVar22 = pcVar11 + 8;
        puVar23 = puVar10;
        if (pcVar15 + -0xc < pcVar19) {
          if (pcVar15 + -5 < pcVar19) goto LAB_0011e8ae;
          pcVar11 = pcVar20;
          pcVar26 = pcVar22;
          if (pcVar22 < pcVar12) {
            do {
              *(undefined8 *)pcVar26 = *(undefined8 *)pcVar11;
              pcVar26 = pcVar26 + 8;
              pcVar11 = pcVar11 + 8;
            } while (pcVar26 < pcVar12);
            pcVar20 = pcVar20 + ((long)pcVar12 - (long)pcVar22);
            pcVar22 = pcVar12;
          }
          for (; pcVar22 < pcVar19; pcVar22 = pcVar22 + 1) {
            cVar4 = *pcVar20;
            pcVar20 = pcVar20 + 1;
            *pcVar22 = cVar4;
          }
        }
        else {
          *(undefined8 *)pcVar22 = *(undefined8 *)pcVar20;
          if (0x10 < uVar25 + 4) {
            pcVar11 = pcVar11 + 0x10;
            do {
              pcVar20 = pcVar20 + 8;
              *(undefined8 *)pcVar11 = *(undefined8 *)pcVar20;
              pcVar11 = pcVar11 + 8;
            } while (pcVar11 < pcVar19);
          }
        }
      } while( true );
    }
  }
  return iVar9;
}

Assistant:

int LZ4_decompress_safe_usingDict(const char* source, char* dest, int compressedSize, int maxOutputSize, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize, dictStart, (size_t)dictSize);
}